

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::LemmaLogger::LemmaLogger(LemmaLogger *this,string *to,Options *o)

{
  bool bVar1;
  char *__filename;
  undefined8 uVar2;
  undefined8 *in_RDX;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  string *in_stack_ffffffffffffffb0;
  FILE *local_38;
  
  bVar1 = isStdOut(in_stack_ffffffffffffffb0);
  if (bVar1) {
    local_38 = _stdout;
  }
  else {
    __filename = (char *)std::__cxx11::string::c_str();
    local_38 = fopen(__filename,"w");
  }
  (in_RDI->ebo_).buf = (pointer)local_38;
  bk_lib::pod_vector<int,_std::allocator<int>_>::pod_vector
            ((pod_vector<int,_std::allocator<int>_> *)in_RDI);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector(in_RDI);
  in_RDI[2].ebo_.size = 2;
  *(undefined8 *)&in_RDI[2].ebo_.cap = *in_RDX;
  *(undefined4 *)((long)&in_RDI[3].ebo_.buf + 4) = *(undefined4 *)(in_RDX + 1);
  in_RDI[3].ebo_.size = 0;
  if ((in_RDI->ebo_).buf == (pointer)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    Potassco::fail(-3,"Clasp::Cli::LemmaLogger::LemmaLogger(const std::string &, const Options &)",
                   0x238,"str_","Could not open lemma log file \'%s\'!",uVar2,0);
  }
  return;
}

Assistant:

LemmaLogger::LemmaLogger(const std::string& to, const Options& o)
	: str_(isStdOut(to) ? stdout : fopen(to.c_str(), "w"))
	, inputType_(Problem_t::Asp)
	, options_(o)
	, step_(0) {
	POTASSCO_EXPECT(str_, "Could not open lemma log file '%s'!", to.c_str());
}